

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O0

strpool_internal_entry_t * strpool_internal_get_entry(strpool_t *pool,unsigned_long_long handle)

{
  int iVar1;
  uint uVar2;
  int counter;
  int index;
  unsigned_long_long handle_local;
  strpool_t *pool_local;
  
  iVar1 = strpool_internal_index_from_handle(handle,pool->index_mask);
  uVar2 = strpool_internal_counter_from_handle(handle,pool->counter_shift,pool->counter_mask);
  if (((iVar1 < 0) || (pool->handle_count <= iVar1)) ||
     (uVar2 != (pool->handles[iVar1].counter & (uint)pool->counter_mask))) {
    pool_local = (strpool_t *)0x0;
  }
  else {
    pool_local = (strpool_t *)(pool->entries + pool->handles[iVar1].entry_index);
  }
  return (strpool_internal_entry_t *)pool_local;
}

Assistant:

static strpool_internal_entry_t* strpool_internal_get_entry( strpool_t const* pool, STRPOOL_U64 handle )
    {
    int index = strpool_internal_index_from_handle( handle, pool->index_mask );
    int counter = strpool_internal_counter_from_handle( handle, pool->counter_shift, pool->counter_mask );

    if( index >= 0 && index < pool->handle_count && 
        counter == (int) ( pool->handles[ index ].counter & pool->counter_mask ) )
            return &pool->entries[ pool->handles[ index ].entry_index ];

    return 0;
    }